

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBoxButton::paintEvent(QToolBoxButton *this,QPaintEvent *param_1)

{
  long lVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QPainter paint;
  QStyleOptionToolBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _paint = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&paint,&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice);
  opt._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBox::QStyleOptionToolBox(&opt);
  initStyleOption(this,&opt);
  pQVar2 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar2 + 0xb8))
            (pQVar2,0x1a,&opt,&paint,
             *(undefined8 *)(*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10)
            );
  QStyleOptionToolBox::~QStyleOptionToolBox(&opt);
  QPainter::~QPainter(&paint);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxButton::paintEvent(QPaintEvent *)
{
    QPainter paint(this);
    QPainter *p = &paint;
    QStyleOptionToolBox opt;
    initStyleOption(&opt);
    style()->drawControl(QStyle::CE_ToolBoxTab, &opt, p, parentWidget());
}